

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O0

int is_eligible_distance(int point1x,int point1y,int point2x,int point2y,int width,int height)

{
  int local_20;
  int thresh;
  int height_local;
  int width_local;
  int point2y_local;
  int point2x_local;
  int point1y_local;
  int point1x_local;
  
  local_20 = width;
  if (width < height) {
    local_20 = height;
  }
  return (int)((point1x - point2x) * (point1x - point2x) + (point1y - point2y) * (point1y - point2y)
              <= (local_20 >> 4) * (local_20 >> 4));
}

Assistant:

static int is_eligible_distance(int point1x, int point1y, int point2x,
                                int point2y, int width, int height) {
  const int thresh = (width < height ? height : width) >> 4;
  return ((point1x - point2x) * (point1x - point2x) +
          (point1y - point2y) * (point1y - point2y)) <= thresh * thresh;
}